

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O0

void __thiscall DIS::EnvironmentType::marshal(EnvironmentType *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  EnvironmentType *this_local;
  
  DataStream::operator<<(dataStream,this->_entityKind);
  DataStream::operator<<(dataStream,this->_domain);
  DataStream::operator<<(dataStream,this->_entityClass);
  DataStream::operator<<(dataStream,this->_category);
  DataStream::operator<<(dataStream,this->_subcategory);
  DataStream::operator<<(dataStream,this->_specific);
  DataStream::operator<<(dataStream,this->_extra);
  return;
}

Assistant:

void EnvironmentType::marshal(DataStream& dataStream) const
{
    dataStream << _entityKind;
    dataStream << _domain;
    dataStream << _entityClass;
    dataStream << _category;
    dataStream << _subcategory;
    dataStream << _specific;
    dataStream << _extra;
}